

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDrawText(Image *dst,char *text,int posX,int posY,int fontSize,Color color)

{
  Font font;
  Vector2 position_00;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Vector2 position;
  int fontSize_local;
  int posY_local;
  int posX_local;
  char *text_local;
  Image *dst_local;
  Color color_local;
  
  GetFontDefault();
  position_00.y = (float)posY;
  position_00.x = (float)posX;
  font._8_8_ = uStack_60;
  font._0_8_ = local_68;
  font.texture._4_8_ = local_58;
  font.texture._12_8_ = uStack_50;
  font.recs = (Rectangle *)local_48;
  font.chars = uStack_40;
  ImageDrawTextEx(dst,font,text,position_00,(float)fontSize,(float)fontSize / 10.0,color);
  return;
}

Assistant:

void ImageDrawText(Image *dst, const char *text, int posX, int posY, int fontSize, Color color)
{
    Vector2 position = { (float)posX, (float)posY };

    // NOTE: For default font, sapcing is set to desired font size / default font size (10)
    ImageDrawTextEx(dst, GetFontDefault(), text, position, (float)fontSize, (float)fontSize/10, color);
}